

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::CommandLineInterface::WriteDescriptorSet
          (CommandLineInterface *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files)

{
  FileDescriptor *file;
  byte bVar1;
  int iVar2;
  size_type sVar3;
  const_reference ppFVar4;
  RepeatedPtrField<google::protobuf::FileDescriptorProto> *output;
  char *pcVar5;
  int *piVar6;
  ostream *poVar7;
  bool bVar8;
  FileOutputStream local_f8 [8];
  FileOutputStream out;
  int fd;
  FileDescriptorProto *file_proto;
  int i_1;
  int local_84;
  undefined1 local_80 [4];
  int i;
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  already_seen;
  FileDescriptorSet file_set;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *parsed_files_local;
  CommandLineInterface *this_local;
  
  google::protobuf::FileDescriptorSet::FileDescriptorSet
            ((FileDescriptorSet *)&already_seen._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if ((this->imports_in_descriptor_set_ & 1U) == 0) {
    for (file_proto._0_4_ = 0;
        sVar3 = std::
                vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                ::size(parsed_files), (ulong)(long)(int)file_proto < sVar3;
        file_proto._0_4_ = (int)file_proto + 1) {
      FileDescriptorSet::add_file
                ((FileDescriptorSet *)&already_seen._M_t._M_impl.super__Rb_tree_header._M_node_count
                );
      ppFVar4 = std::
                vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                ::operator[](parsed_files,(long)(int)file_proto);
      google::protobuf::FileDescriptor::CopyTo((FileDescriptorProto *)*ppFVar4);
      if ((this->source_info_in_descriptor_set_ & 1U) != 0) {
        ppFVar4 = std::
                  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                  ::operator[](parsed_files,(long)(int)file_proto);
        google::protobuf::FileDescriptor::CopySourceCodeInfoTo((FileDescriptorProto *)*ppFVar4);
      }
    }
  }
  else {
    std::
    set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::set((set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
           *)local_80);
    for (local_84 = 0;
        sVar3 = std::
                vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                ::size(parsed_files), (ulong)(long)local_84 < sVar3; local_84 = local_84 + 1) {
      ppFVar4 = std::
                vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                ::operator[](parsed_files,(long)local_84);
      file = *ppFVar4;
      bVar8 = this->source_info_in_descriptor_set_;
      output = FileDescriptorSet::mutable_file
                         ((FileDescriptorSet *)
                          &already_seen._M_t._M_impl.super__Rb_tree_header._M_node_count);
      GetTransitiveDependencies
                (file,(bool)(bVar8 & 1),
                 (set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                  *)local_80,output);
    }
    std::
    set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::~set((set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            *)local_80);
  }
  do {
    pcVar5 = (char *)std::__cxx11::string::c_str();
    iVar2 = open(pcVar5,0x241,0x1b6);
    bVar8 = false;
    if (iVar2 < 0) {
      piVar6 = __errno_location();
      bVar8 = *piVar6 == 4;
    }
  } while (bVar8);
  if (iVar2 < 0) {
    pcVar5 = (char *)std::__cxx11::string::c_str();
    perror(pcVar5);
    this_local._7_1_ = false;
  }
  else {
    google::protobuf::io::FileOutputStream::FileOutputStream(local_f8,iVar2,-1);
    bVar1 = google::protobuf::MessageLite::SerializeToZeroCopyStream
                      ((ZeroCopyOutputStream *)
                       &already_seen._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if ((bVar1 & 1) == 0) {
      poVar7 = std::operator<<((ostream *)&std::cerr,(string *)&this->descriptor_set_name_);
      poVar7 = std::operator<<(poVar7,": ");
      iVar2 = io::FileOutputStream::GetErrno(local_f8);
      pcVar5 = strerror(iVar2);
      poVar7 = std::operator<<(poVar7,pcVar5);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      google::protobuf::io::FileOutputStream::Close();
      this_local._7_1_ = false;
    }
    else {
      bVar1 = google::protobuf::io::FileOutputStream::Close();
      if ((bVar1 & 1) == 0) {
        poVar7 = std::operator<<((ostream *)&std::cerr,(string *)&this->descriptor_set_name_);
        poVar7 = std::operator<<(poVar7,": ");
        iVar2 = io::FileOutputStream::GetErrno(local_f8);
        pcVar5 = strerror(iVar2);
        poVar7 = std::operator<<(poVar7,pcVar5);
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
    google::protobuf::io::FileOutputStream::~FileOutputStream(local_f8);
  }
  google::protobuf::FileDescriptorSet::~FileDescriptorSet
            ((FileDescriptorSet *)&already_seen._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return this_local._7_1_;
}

Assistant:

bool CommandLineInterface::WriteDescriptorSet(
    const vector<const FileDescriptor*> parsed_files) {
  FileDescriptorSet file_set;

  if (imports_in_descriptor_set_) {
    set<const FileDescriptor*> already_seen;
    for (int i = 0; i < parsed_files.size(); i++) {
      GetTransitiveDependencies(parsed_files[i],
                                source_info_in_descriptor_set_,
                                &already_seen, file_set.mutable_file());
    }
  } else {
    for (int i = 0; i < parsed_files.size(); i++) {
      FileDescriptorProto* file_proto = file_set.add_file();
      parsed_files[i]->CopyTo(file_proto);
      if (source_info_in_descriptor_set_) {
        parsed_files[i]->CopySourceCodeInfoTo(file_proto);
      }
    }
  }

  int fd;
  do {
    fd = open(descriptor_set_name_.c_str(),
              O_WRONLY | O_CREAT | O_TRUNC | O_BINARY, 0666);
  } while (fd < 0 && errno == EINTR);

  if (fd < 0) {
    perror(descriptor_set_name_.c_str());
    return false;
  }

  io::FileOutputStream out(fd);
  if (!file_set.SerializeToZeroCopyStream(&out)) {
    cerr << descriptor_set_name_ << ": " << strerror(out.GetErrno()) << endl;
    out.Close();
    return false;
  }
  if (!out.Close()) {
    cerr << descriptor_set_name_ << ": " << strerror(out.GetErrno()) << endl;
    return false;
  }

  return true;
}